

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall
duckdb::CSVErrorHandler::FillRejectsTable
          (CSVErrorHandler *this,InternalAppender *errors_appender,idx_t file_idx,idx_t scan_idx,
          CSVFileScan *file,CSVRejectsTable *rejects,MultiFileBindData *bind_data,idx_t limit)

{
  char cVar1;
  pointer pCVar2;
  ulong __n;
  CSVErrorHandler *pCVar3;
  idx_t iVar4;
  const_reference pvVar5;
  CSVErrorType extraout_DL;
  CSVErrorType extraout_DL_00;
  CSVErrorType type;
  string *value;
  Value *this_00;
  LogicalType *type_00;
  anon_union_16_2_67f50693_for_value *this_01;
  anon_union_16_2_67f50693_for_value local_258;
  anon_union_16_2_67f50693_for_value local_248;
  anon_union_16_2_67f50693_for_value local_238;
  LogicalType local_228;
  LogicalType local_210;
  LogicalType local_1f8;
  LogicalType local_1e0;
  LogicalType local_1c8;
  string local_1b0;
  anon_union_16_2_67f50693_for_value local_190;
  anon_union_16_2_67f50693_for_value local_180;
  Value local_170;
  Value local_130;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  ::std::mutex::lock(&this->main_mutex);
  pCVar3 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&file->error_handler);
  pCVar2 = (pCVar3->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  value = &((pCVar3->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
            super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
            super__Vector_impl_data._M_start)->csv_row;
  do {
    if ((pointer)&value[-3].field_2 == pCVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    if ((((byte)value[-1].field_2._M_local_buf[0] < 10) &&
        ((0x35dU >> ((byte)value[-1].field_2._M_local_buf[0] & 0x1f) & 1) != 0)) &&
       (rejects->count <= limit - 1)) {
      rejects->count = rejects->count + 1;
      pCVar3 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&file->error_handler);
      iVar4 = GetLineInternal(pCVar3,(LinesPerBoundary *)(value + 1));
      __n = *(ulong *)((long)&value[-1].field_2 + 8);
      BaseAppender::BeginRow(&errors_appender->super_BaseAppender);
      BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,scan_idx);
      BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,file_idx);
      BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,iVar4);
      BaseAppender::Append<unsigned_long>
                (&errors_appender->super_BaseAppender,value[1].field_2._M_allocated_capacity + 1);
      if (*(long *)((long)&value[1].field_2 + 8) == -1) {
        LogicalType::LogicalType(&local_210,SQLNULL);
        Value::Value(&local_70,&local_210);
        BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,&local_70);
        Value::~Value(&local_70);
        LogicalType::~LogicalType(&local_210);
      }
      else {
        iVar4 = optional_idx::GetIndex((optional_idx *)((long)&value[1].field_2 + 8));
        BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,iVar4 + 1);
      }
      if (value[-1].field_2._M_local_buf[0] == '\x06') {
        LogicalType::LogicalType(&local_228,SQLNULL);
        Value::Value(&local_b0,&local_228);
        BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,&local_b0);
        Value::~Value(&local_b0);
        LogicalType::~LogicalType(&local_228);
      }
      else {
        BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,__n + 1);
      }
      cVar1 = value[-1].field_2._M_local_buf[0];
      if (cVar1 == '\x02') {
        if ((ulong)((long)(bind_data->names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(bind_data->names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n + 1) {
          LogicalType::LogicalType(&local_1e0,SQLNULL);
          this_00 = &local_130;
          type_00 = &local_1e0;
          Value::Value(this_00,type_00);
          BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_00);
          goto LAB_0099f3ca;
        }
        pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&bind_data->names,__n + 1);
        this_01 = &local_180;
        string_t::string_t((string_t *)&this_01->pointer,pvVar5);
LAB_0099f46a:
        BaseAppender::Append<duckdb::string_t>
                  (&errors_appender->super_BaseAppender,(string_t)this_01->pointer);
        type = extraout_DL_00;
      }
      else {
        if ((cVar1 == '\x06') || (cVar1 == '\x03')) {
          LogicalType::LogicalType(&local_1c8,SQLNULL);
          this_00 = &local_f0;
          type_00 = &local_1c8;
          Value::Value(this_00,type_00);
          BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_00);
        }
        else {
          if (__n < (ulong)((long)(bind_data->names).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(bind_data->names).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::get<true>(&bind_data->names,__n);
            this_01 = &local_190;
            string_t::string_t((string_t *)&this_01->pointer,pvVar5);
            goto LAB_0099f46a;
          }
          LogicalType::LogicalType(&local_1f8,SQLNULL);
          this_00 = &local_170;
          type_00 = &local_1f8;
          Value::Value(this_00,type_00);
          BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_00);
        }
LAB_0099f3ca:
        Value::~Value(this_00);
        LogicalType::~LogicalType(type_00);
        type = extraout_DL;
      }
      CSVErrorTypeToEnum_abi_cxx11_
                (&local_1b0,(duckdb *)(ulong)(byte)value[-1].field_2._M_local_buf[0],type);
      string_t::string_t((string_t *)&local_238.pointer,&local_1b0);
      BaseAppender::Append<duckdb::string_t>
                (&errors_appender->super_BaseAppender,(string_t)local_238.pointer);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      string_t::string_t((string_t *)&local_248.pointer,value);
      BaseAppender::Append<duckdb::string_t>
                (&errors_appender->super_BaseAppender,(string_t)local_248.pointer);
      string_t::string_t((string_t *)&local_258.pointer,(string *)&value[-3].field_2);
      BaseAppender::Append<duckdb::string_t>
                (&errors_appender->super_BaseAppender,(string_t)local_258.pointer);
      BaseAppender::EndRow(&errors_appender->super_BaseAppender);
    }
    value = (string *)&value[4].field_2;
  } while( true );
}

Assistant:

void CSVErrorHandler::FillRejectsTable(InternalAppender &errors_appender, const idx_t file_idx, const idx_t scan_idx,
                                       const CSVFileScan &file, CSVRejectsTable &rejects,
                                       const MultiFileBindData &bind_data, const idx_t limit) {
	lock_guard<mutex> parallel_lock(main_mutex);
	// We first insert the file into the file scans table
	for (auto &error : file.error_handler->errors) {
		if (!IsCSVErrorAcceptedReject(error.type)) {
			continue;
		}
		// short circuit if we already have too many rejects
		if (limit == 0 || rejects.count < limit) {
			if (limit != 0 && rejects.count >= limit) {
				break;
			}
			rejects.count++;
			const auto row_line = file.error_handler->GetLineInternal(error.error_info);
			const auto col_idx = error.column_idx;
			// Add the row to the rejects table
			errors_appender.BeginRow();
			// 1. Scan ID
			errors_appender.Append(scan_idx);
			// 2. File ID
			errors_appender.Append(file_idx);
			// 3. Row Line
			errors_appender.Append(row_line);
			// 4. Byte Position of the row error
			errors_appender.Append(error.row_byte_position + 1);
			// 5. Byte Position where error occurred
			if (!error.byte_position.IsValid()) {
				// This means this error comes from a flush, and we don't support this yet, so we give it
				// a null
				errors_appender.Append(Value());
			} else {
				errors_appender.Append(error.byte_position.GetIndex() + 1);
			}
			// 6. Column Index
			if (error.type == CSVErrorType::MAXIMUM_LINE_SIZE) {
				errors_appender.Append(Value());
			} else {
				errors_appender.Append(col_idx + 1);
			}
			// 7. Column Name (If Applicable)
			switch (error.type) {
			case CSVErrorType::TOO_MANY_COLUMNS:
			case CSVErrorType::MAXIMUM_LINE_SIZE:
				errors_appender.Append(Value());
				break;
			case CSVErrorType::TOO_FEW_COLUMNS:
				if (col_idx + 1 < bind_data.names.size()) {
					errors_appender.Append(string_t(bind_data.names[col_idx + 1]));
				} else {
					errors_appender.Append(Value());
				}
				break;
			default:
				if (col_idx < bind_data.names.size()) {
					errors_appender.Append(string_t(bind_data.names[col_idx]));
				} else {
					errors_appender.Append(Value());
				}
			}
			// 8. Error Type
			errors_appender.Append(string_t(CSVErrorTypeToEnum(error.type)));
			// 9. Original CSV Line
			errors_appender.Append(string_t(error.csv_row));
			// 10. Full Error Message
			errors_appender.Append(string_t(error.error_message));
			errors_appender.EndRow();
		}
	}
}